

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_utils.h
# Opt level: O1

void xray_re::
     trim_container<std::vector<xray_re::xr_ini_file::ini_section*,std::allocator<xray_re::xr_ini_file::ini_section*>>>
               (vector<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
                *container)

{
  pointer ppiVar1;
  ini_section *this;
  pointer ppiVar2;
  
  ppiVar1 = (container->
            super__Vector_base<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  for (ppiVar2 = (container->
                 super__Vector_base<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
                 )._M_impl.super__Vector_impl_data._M_start; ppiVar2 != ppiVar1;
      ppiVar2 = ppiVar2 + 1) {
    this = *ppiVar2;
    if (this != (ini_section *)0x0) {
      xr_ini_file::ini_section::~ini_section(this);
      operator_delete(this,0x38);
    }
  }
  ppiVar2 = (container->
            super__Vector_base<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppiVar1 = (container->
            super__Vector_base<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (container->
  super__Vector_base<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (container->
  super__Vector_base<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (container->
  super__Vector_base<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (ppiVar2 != (pointer)0x0) {
    operator_delete(ppiVar2,(long)ppiVar1 - (long)ppiVar2);
    return;
  }
  return;
}

Assistant:

void trim_container(T& container)
{
	for (typename T::iterator it = container.begin(), end = container.end(); it != end; ++it)
		delete *it;
	T().swap(container);
}